

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_p.h
# Opt level: O0

socklen_t anon_unknown.dwarf_8d754d::setSockaddr(sockaddr_in *sin,QHostAddress *addr,quint16 port)

{
  long lVar1;
  uint16_t uVar2;
  quint32 __hostlong;
  uint32_t uVar3;
  uint16_t in_DX;
  sockaddr_in *in_RDI;
  long in_FS_OFFSET;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  QHostAddress *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  this = (QHostAddress *)0x0;
  in_RDI->sin_family = 0;
  in_RDI->sin_port = 0;
  (in_RDI->sin_addr).s_addr = 0;
  in_RDI->sin_zero[0] = '\0';
  in_RDI->sin_zero[1] = '\0';
  in_RDI->sin_zero[2] = '\0';
  in_RDI->sin_zero[3] = '\0';
  in_RDI->sin_zero[4] = '\0';
  in_RDI->sin_zero[5] = '\0';
  in_RDI->sin_zero[6] = '\0';
  in_RDI->sin_zero[7] = '\0';
  SetSALen::set<sockaddr_in>(in_RDI,0x10);
  in_RDI->sin_family = 2;
  uVar2 = htons(in_DX);
  in_RDI->sin_port = uVar2;
  __hostlong = QHostAddress::toIPv4Address(this,(bool *)CONCAT44(uVar6,CONCAT22(uVar5,uVar4)));
  uVar3 = htonl(__hostlong);
  (in_RDI->sin_addr).s_addr = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0x10;
  }
  __stack_chk_fail();
}

Assistant:

inline QT_SOCKLEN_T setSockaddr(sockaddr_in *sin, const QHostAddress &addr, quint16 port = 0)
{
    *sin = {};
    SetSALen::set(sin, sizeof(*sin));
    sin->sin_family = AF_INET;
    sin->sin_port = htons(port);
    sin->sin_addr.s_addr = htonl(addr.toIPv4Address());
    return sizeof(*sin);
}